

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O1

NodeRecordMB4D * __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  Split *pSVar3;
  float fVar4;
  undefined8 uVar5;
  int iVar6;
  undefined4 uVar7;
  uint uVar8;
  BBox1f BVar9;
  MemoryMonitorInterface *pMVar10;
  BBox1f BVar11;
  BBox1f BVar12;
  ThreadLocal2 *pTVar13;
  iterator iVar14;
  Instance *pIVar15;
  BBox1f *pBVar16;
  float fVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Vec3fa VVar31;
  undefined8 uVar32;
  vint *pvVar33;
  BBox1f BVar34;
  undefined8 uVar35;
  char cVar36;
  long lVar37;
  long lVar38;
  SetMB *this_00;
  void *pvVar39;
  ulong uVar40;
  float *pfVar41;
  size_t sVar42;
  undefined8 *puVar43;
  runtime_error *prVar44;
  BBox1f *pBVar45;
  byte bVar46;
  pointer *__ptr;
  ulong uVar47;
  ulong uVar48;
  byte bVar49;
  char *pcVar50;
  ulong uVar51;
  ulong uVar52;
  mvector<PrimRefMB> *prims;
  BuildRecord *in_00;
  uint *puVar53;
  bool bVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar60;
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar70;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar75;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar76;
  undefined1 auVar77 [16];
  float fVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  undefined1 local_1e08 [16];
  undefined1 local_1df8 [16];
  undefined1 local_1dd8 [16];
  undefined1 local_1dc8 [16];
  BBox1f time_range1;
  BBox1f time_range0;
  PrimRefVector lprims;
  PrimInfoMB right;
  PrimInfoMB left;
  anon_class_1_0_00000001 reduction;
  LBBox3fa lbbox_1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1bd8;
  BBox1f local_1bc8;
  size_t sStack_1bc0;
  size_t sStack_1bb8;
  BBox1f BStack_1bb0;
  BBox1f local_1ba8;
  BBox1f BStack_1ba0;
  size_t sStack_1b98;
  size_t sStack_1b90;
  undefined1 auStack_1b88 [16];
  BBox1f local_1b78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b08;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1af8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ae8;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  BBox1f local_1aa8;
  BBox1f BStack_1aa0;
  size_t sStack_1a98;
  size_t sStack_1a90;
  undefined1 auStack_1a88 [16];
  BBox1f local_1a78;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined8 local_1a58;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_19d8 [16];
  anon_class_24_3_c5d13451 isLeft;
  vint vSplitPos;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined8 local_1898;
  undefined8 uStack_1890;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1888;
  undefined8 local_1878;
  undefined8 uStack_1870;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1868;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1858;
  BBox1f local_1848;
  BBox1f BStack_1840;
  size_t sStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  BBox1f BStack_1820;
  BBox1f local_1818;
  undefined8 local_1808;
  uint uStack_17fc;
  undefined8 local_17f8;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined1 auStack_17d8 [8];
  undefined1 auStack_17d0 [8];
  LBBox3fa lbbox;
  undefined1 local_1788 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1778;
  undefined1 local_1768 [16];
  BBox1f local_1758 [2];
  size_t asStack_1748 [2];
  BBox1f local_1738;
  float fStack_1730;
  uint uStack_172c;
  BBox1f local_1728 [2];
  Split local_1718 [57];
  BBox1f *local_8c8 [16];
  ulong local_848;
  BBox1f local_840;
  BBox1f local_838 [63];
  long local_640;
  NodeRecordMB4D values [16];
  
  uVar40 = in->depth;
  if ((this->cfg).maxDepth < uVar40) {
    puVar43 = (undefined8 *)__cxa_allocate_exception(0x30);
    lbbox.bounds0.lower.field_0._0_8_ = &lbbox.bounds0.upper;
    std::__cxx11::string::_M_construct<char_const*>((string *)&lbbox,"depth limit reached","");
    *puVar43 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar43 + 1) = 1;
    puVar43[2] = puVar43 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar43 + 2),lbbox.bounds0.lower.field_0._0_8_,
               CONCAT71(lbbox.bounds0.lower.field_0._9_7_,lbbox.bounds0.lower.field_0._8_1_) +
               lbbox.bounds0.lower.field_0._0_8_);
    __cxa_throw(puVar43,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  uVar5 = *(undefined8 *)
           &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
            bounds0.lower.field_0;
  uVar18 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds0.lower.field_0 + 8);
  uVar19 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds0.upper.field_0;
  uVar20 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds0.upper.field_0 + 8);
  aVar71 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.lower.field_0;
  uVar21 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds1.upper.field_0;
  uVar22 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds1.upper.field_0 + 8);
  aVar70 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           lower.field_0;
  aVar75 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           upper.field_0;
  values[0].ref.ptr = (in->prims).super_PrimInfoMB.num_time_segments;
  values[0]._8_8_ = (in->prims).super_PrimInfoMB.max_num_time_segments;
  values[0].lbounds.bounds0.lower.field_0._0_8_ = (in->prims).super_PrimInfoMB.max_time_range;
  values[0].lbounds.bounds0.lower.field_0._8_8_ = (in->prims).super_PrimInfoMB.time_range;
  BVar9 = (BBox1f)(in->prims).prims;
  BVar11 = (BBox1f)(in->prims).super_PrimInfoMB.object_range._begin;
  BVar12 = (BBox1f)(in->prims).super_PrimInfoMB.object_range._end;
  findFallback((Split *)&lbbox,this,&in->prims);
  local_1718[0].mapping.ofs.field_0._8_8_ = lbbox.bounds1.lower.field_0._8_8_;
  local_1718[0].mapping.ofs.field_0._0_8_ = lbbox.bounds1.lower.field_0._0_8_;
  local_1718[0].mapping.num = lbbox.bounds0.upper.field_0._0_8_;
  uVar32 = lbbox.bounds0.lower.field_0._0_8_;
  local_18a8 = uVar5;
  uStack_18a0 = uVar18;
  local_1898 = uVar19;
  uStack_1890 = uVar20;
  local_1888 = aVar71;
  local_1878 = uVar21;
  uStack_1870 = uVar22;
  local_1868 = aVar70;
  local_1858 = aVar75;
  local_1848 = BVar11;
  BStack_1840 = BVar12;
  sStack_1838 = values[0].ref.ptr;
  uStack_1830 = values[0]._8_8_;
  uStack_1828 = values[0].lbounds.bounds0.lower.field_0._0_8_;
  BStack_1820.lower = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  BStack_1820.upper = (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  BVar34 = BStack_1820;
  local_1818 = BVar9;
  local_1808 = lbbox.bounds0.lower.field_0._0_8_;
  local_17f8 = lbbox.bounds0.upper.field_0._0_8_;
  local_1718[0].mapping.scale.field_0._0_8_ = lbbox.bounds1.upper.field_0._0_8_;
  local_1718[0].mapping.scale.field_0._8_8_ = lbbox.bounds1.upper.field_0._8_8_;
  local_17e8 = lbbox.bounds1.lower.field_0._0_8_;
  uStack_17e0 = lbbox.bounds1.lower.field_0._8_8_;
  auStack_17d8 = (undefined1  [8])lbbox.bounds1.upper.field_0._0_8_;
  auStack_17d0 = (undefined1  [8])lbbox.bounds1.upper.field_0._8_8_;
  if ((uVar40 == 1) && (BVar12 != BVar11)) {
    BStack_1820.lower = (float)values[0].lbounds.bounds0.lower.field_0._8_8_;
    BStack_1820.upper = (float)((ulong)values[0].lbounds.bounds0.lower.field_0._8_8_ >> 0x20);
    lVar37 = (long)BVar12 - (long)BVar11;
    if ((ulong)BVar12 < (ulong)BVar11 || lVar37 == 0) {
      auVar56 = ZEXT816(0xff8000007f800000);
    }
    else {
      pBVar45 = &(*(PrimRefMB **)((long)BVar9 + 0x20))[(long)BVar11].time_range;
      auVar56 = ZEXT816(0xff8000007f800000);
      do {
        auVar72._8_8_ = 0;
        auVar72._0_4_ = pBVar45->lower;
        auVar72._4_4_ = pBVar45->upper;
        auVar58 = vcmpps_avx(auVar56,auVar72,1);
        auVar57 = vinsertps_avx(auVar56,auVar72,0x50);
        auVar56 = vblendps_avx(auVar72,auVar56,2);
        auVar56 = vblendvps_avx(auVar56,auVar57,auVar58);
        pBVar45 = pBVar45 + 10;
        lVar37 = lVar37 + -1;
      } while (lVar37 != 0);
    }
    auVar58 = vmovshdup_avx(auVar56);
    auVar58 = vcmpps_avx(auVar58,ZEXT416((uint)BStack_1820.upper),1);
    auVar56 = vcmpps_avx(ZEXT416((uint)BStack_1820.lower),auVar56,1);
    auVar56 = vorps_avx(auVar56,auVar58);
    bVar46 = auVar56[0] & 1;
  }
  else {
    bVar46 = 0;
  }
  uVar52 = (long)BVar12 - (long)BVar11;
  BStack_1820 = BVar34;
  if (((uVar52 <= (this->cfg).maxLeafSize) &&
      (uStack_17fc = (uint)((uint7)lbbox.bounds0.lower.field_0._9_7_ >> 0x18), uStack_17fc < 2)) &&
     (bVar46 == 0)) {
    local_1b18._0_8_ = uVar52 * 0x10;
    pTVar13 = (alloc.talloc1)->parent;
    if (alloc.alloc != (pTVar13->alloc)._M_b._M_p) {
      values[0]._8_1_ = 1;
      values[0].ref.ptr = (size_t)pTVar13;
      MutexSys::lock(&pTVar13->mutex);
      if ((pTVar13->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar13->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar13->alloc1).bytesUsed + (pTVar13->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar13->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar13->alloc0).end + (pTVar13->alloc1).end) -
             ((pTVar13->alloc0).cur + (pTVar13->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar13->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar13->alloc1).bytesWasted + (pTVar13->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar61 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar13->alloc0).end = auVar61._0_8_;
      (pTVar13->alloc0).allocBlockSize = auVar61._8_8_;
      (pTVar13->alloc0).bytesUsed = auVar61._16_8_;
      (pTVar13->alloc0).bytesWasted = auVar61._24_8_;
      (pTVar13->alloc0).ptr = (char *)auVar61._0_8_;
      (pTVar13->alloc0).cur = auVar61._8_8_;
      (pTVar13->alloc0).end = auVar61._16_8_;
      (pTVar13->alloc0).allocBlockSize = auVar61._24_8_;
      auVar61 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar13->alloc1).end = auVar61._0_8_;
        (pTVar13->alloc1).allocBlockSize = auVar61._8_8_;
        (pTVar13->alloc1).bytesUsed = auVar61._16_8_;
        (pTVar13->alloc1).bytesWasted = auVar61._24_8_;
        (pTVar13->alloc1).ptr = (char *)auVar61._0_8_;
        (pTVar13->alloc1).cur = auVar61._8_8_;
        (pTVar13->alloc1).end = auVar61._16_8_;
        (pTVar13->alloc1).allocBlockSize = auVar61._24_8_;
      }
      else {
        (pTVar13->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar13->alloc1).ptr = (char *)auVar61._0_8_;
        (pTVar13->alloc1).cur = auVar61._8_8_;
        (pTVar13->alloc1).end = auVar61._16_8_;
        (pTVar13->alloc1).allocBlockSize = auVar61._24_8_;
        (pTVar13->alloc1).end = auVar61._0_8_;
        (pTVar13->alloc1).allocBlockSize = auVar61._8_8_;
        (pTVar13->alloc1).bytesUsed = auVar61._16_8_;
        (pTVar13->alloc1).bytesWasted = auVar61._24_8_;
        (pTVar13->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar13->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      lbbox.bounds0.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      lbbox.bounds0.lower.field_0._8_1_ = 1;
      lbbox_1.bounds0.lower.field_0._0_8_ = pTVar13;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar14._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar14._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar14,(ThreadLocal2 **)&lbbox_1);
      }
      else {
        *iVar14._M_current = (ThreadLocal2 *)lbbox_1.bounds0.lower.field_0._0_8_;
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      if (lbbox.bounds0.lower.field_0._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)lbbox.bounds0.lower.field_0._0_8_);
      }
      if (values[0]._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)values[0].ref.ptr);
      }
    }
    (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + local_1b18._0_8_;
    sVar42 = (alloc.talloc1)->cur;
    uVar40 = (ulong)(-(int)sVar42 & 0xf);
    uVar51 = sVar42 + local_1b18._0_8_ + uVar40;
    (alloc.talloc1)->cur = uVar51;
    if ((alloc.talloc1)->end < uVar51) {
      (alloc.talloc1)->cur = sVar42;
      if ((alloc.talloc1)->allocBlockSize < (ulong)(local_1b18._0_8_ << 2)) {
        pcVar50 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_1b18);
      }
      else {
        lbbox.bounds0.lower.field_0._0_8_ = (alloc.talloc1)->allocBlockSize;
        pcVar50 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox);
        (alloc.talloc1)->ptr = pcVar50;
        sVar42 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar42;
        (alloc.talloc1)->cur = 0;
        (alloc.talloc1)->end = lbbox.bounds0.lower.field_0._0_8_;
        (alloc.talloc1)->cur = local_1b18._0_8_;
        if ((ulong)lbbox.bounds0.lower.field_0._0_8_ < (ulong)local_1b18._0_8_) {
          (alloc.talloc1)->cur = 0;
          lbbox.bounds0.lower.field_0._0_8_ = (alloc.talloc1)->allocBlockSize;
          pcVar50 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox);
          (alloc.talloc1)->ptr = pcVar50;
          sVar42 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar42;
          (alloc.talloc1)->cur = 0;
          (alloc.talloc1)->end = lbbox.bounds0.lower.field_0._0_8_;
          (alloc.talloc1)->cur = local_1b18._0_8_;
          if ((ulong)lbbox.bounds0.lower.field_0._0_8_ < (ulong)local_1b18._0_8_) {
            (alloc.talloc1)->cur = 0;
            pcVar50 = (char *)0x0;
            goto LAB_01431f1c;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar42;
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar40;
      pcVar50 = (alloc.talloc1)->ptr + (uVar51 - local_1b18._0_8_);
    }
LAB_01431f1c:
    uVar40 = 7;
    if (uVar52 < 7) {
      uVar40 = uVar52;
    }
    if (BVar12 == BVar11) {
      aVar71.m128[2] = -INFINITY;
      aVar71._0_8_ = 0xff800000ff800000;
      aVar71.m128[3] = -INFINITY;
      aVar76.m128[2] = INFINITY;
      aVar76._0_8_ = 0x7f8000007f800000;
      aVar76.m128[3] = INFINITY;
      aVar60 = aVar76;
      aVar67 = aVar71;
    }
    else {
      puVar53 = (uint *)(pcVar50 + 8);
      lVar37 = (long)BVar11 * 0x50 + 0xc;
      aVar60.m128[2] = INFINITY;
      aVar60._0_8_ = 0x7f8000007f800000;
      aVar60.m128[3] = INFINITY;
      aVar67.m128[2] = -INFINITY;
      aVar67._0_8_ = 0xff800000ff800000;
      aVar67.m128[3] = -INFINITY;
      aVar71 = aVar67;
      aVar76 = aVar60;
      do {
        values[0].ref.ptr._0_4_ = BStack_1820.lower;
        values[0].ref.ptr._4_4_ = BStack_1820.upper;
        uVar8 = *(uint *)((long)&((*(PrimRefMB **)((long)local_1818 + 0x20))->lbounds).bounds0.lower
                                 .field_0 + lVar37);
        pIVar15 = (Instance *)(((this->createLeaf).bvh)->scene->geometries).items[uVar8].ptr;
        *(Instance **)(puVar53 + -2) = pIVar15;
        *puVar53 = uVar8;
        Instance::nonlinearBounds
                  (&lbbox,pIVar15,(BBox1f *)values,&(pIVar15->super_Geometry).time_range,
                   (pIVar15->super_Geometry).fnumTimeSegments);
        auVar28[8] = lbbox.bounds0.lower.field_0._8_1_;
        auVar28._0_8_ = lbbox.bounds0.lower.field_0._0_8_;
        auVar28._9_7_ = lbbox.bounds0.lower.field_0._9_7_;
        aVar76.m128 = (__m128)vminps_avx(aVar76.m128,auVar28);
        auVar29._8_8_ = lbbox.bounds0.upper.field_0._8_8_;
        auVar29._0_8_ = lbbox.bounds0.upper.field_0._0_8_;
        aVar71.m128 = (__m128)vmaxps_avx(aVar71.m128,auVar29);
        auVar30._8_8_ = lbbox.bounds1.lower.field_0._8_8_;
        auVar30._0_8_ = lbbox.bounds1.lower.field_0._0_8_;
        aVar60.m128 = (__m128)vminps_avx(aVar60.m128,auVar30);
        aVar67.m128 = (__m128)vmaxps_avx(aVar67.m128,lbbox.bounds1.upper.field_0);
        puVar53 = puVar53 + 4;
        lVar37 = lVar37 + 0x50;
        uVar52 = uVar52 - 1;
      } while (uVar52 != 0);
    }
    (__return_storage_ptr__->ref).ptr = uVar40 | (ulong)pcVar50 | 8;
    (__return_storage_ptr__->lbounds).bounds0.lower.field_0 = aVar76;
    (__return_storage_ptr__->lbounds).bounds0.upper.field_0 = aVar71;
    (__return_storage_ptr__->lbounds).bounds1.lower.field_0 = aVar60;
    (__return_storage_ptr__->lbounds).bounds1.upper.field_0 = aVar67;
    __return_storage_ptr__->dt = BStack_1820;
    return __return_storage_ptr__;
  }
  lVar37 = 0xbc;
  do {
    *(undefined8 *)(auStack_17d8 + lVar37 + 4) = 0xffffffff7f800000;
    *(undefined8 *)(auStack_17d0 + lVar37 + 4) = 0;
    lVar37 = lVar37 + 0xf0;
  } while (lVar37 != 0xfbc);
  local_848 = 1;
  local_640 = 1;
  lbbox.bounds0.lower.field_0._0_8_ = uVar40;
  uVar35 = lbbox.bounds0.lower.field_0._0_8_;
  lbbox.bounds0.upper.field_0._0_8_ = uVar5;
  lbbox.bounds0.upper.field_0._8_8_ = uVar18;
  lbbox.bounds1.lower.field_0._0_8_ = uVar19;
  lbbox.bounds1.lower.field_0._8_8_ = uVar20;
  lbbox.bounds1.upper.field_0 = aVar71;
  local_1788._0_8_ = uVar21;
  local_1788._8_8_ = uVar22;
  local_1778 = aVar70;
  local_1768 = (undefined1  [16])aVar75;
  local_1758[0] = BVar11;
  local_1758[1] = BVar12;
  asStack_1748[0] = values[0].ref.ptr;
  asStack_1748[1] = values[0]._8_8_;
  local_1738.lower = (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  local_1738.upper = (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  fStack_1730 = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  uStack_172c = values[0].lbounds.bounds0.lower.field_0._12_4_;
  local_1728[0] = BVar9;
  lbbox.bounds0.lower.field_0._0_4_ = (undefined4)uVar32;
  lbbox.bounds0.lower.field_0._4_4_ = SUB84(uVar32,4);
  local_1718[0].sah = (float)lbbox.bounds0.lower.field_0._0_4_;
  local_1718[0].dim = lbbox.bounds0.lower.field_0._4_4_;
  local_840 = BVar9;
  local_838[0].lower = 2.8026e-45;
  local_838[0].upper = 0.0;
  local_8c8[0] = &local_840;
  local_1dc8._8_4_ = 0x7f800000;
  local_1dc8._0_8_ = 0x7f8000007f800000;
  local_1dc8._12_4_ = 0x7f800000;
  local_1dd8._8_4_ = 0xff800000;
  local_1dd8._0_8_ = 0xff800000ff800000;
  local_1dd8._12_4_ = 0xff800000;
  bVar49 = 0;
  lbbox.bounds0.lower.field_0._0_8_ = uVar35;
  do {
    if (local_848 == 0) {
      uVar52 = 0xffffffffffffffff;
    }
    else {
      uVar52 = 0xffffffffffffffff;
      pBVar45 = local_1758;
      uVar51 = 0;
      uVar47 = 0;
      do {
        uVar48 = (long)pBVar45[1] - (long)*pBVar45;
        if ((((this->cfg).maxLeafSize < uVar48) || (1 < (uint)pBVar45[9].upper)) || (bVar46 != 0)) {
          if (uVar51 < uVar48) {
            uVar52 = uVar47;
            uVar51 = uVar48;
          }
          bVar46 = 0;
        }
        uVar47 = uVar47 + 1;
        pBVar45 = pBVar45 + 0x1e;
      } while (local_848 != uVar47);
    }
    if (uVar52 != 0xffffffffffffffff) {
      lVar37 = uVar52 * 0xf0;
      lbbox_1.bounds0.lower.field_0._0_8_ = uVar40 + 1;
      local_1b18._0_8_ = lbbox_1.bounds0.lower.field_0._0_8_;
      local_1a68 = 0xffffffff7f800000;
      uStack_1a60 = 0;
      pSVar3 = (Split *)((long)local_1718 + lVar37);
      iVar6 = *(int *)((long)local_1718 + lVar37 + 0xc);
      if (iVar6 == 0) {
        local_1ba8 = local_1758[uVar52 * 0x1e];
        BVar9 = local_1758[uVar52 * 0x1e + 1];
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[2]
             = INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
             0x7f8000007f800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[3]
             = INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2]
             = -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
             0xff800000ff800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3]
             = -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2]
             = INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_ =
             0x7f8000007f800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3]
             = INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[2]
             = -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_ =
             0xff800000ff800000;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[3]
             = -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
             INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
             INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
             INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
             INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
             -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
             -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
             -INFINITY;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
             -INFINITY;
        left.max_time_range.lower = 0.0;
        left.object_range._begin = 0;
        left.object_range._end = 0;
        left.num_time_segments = 0;
        left.max_num_time_segments = 0;
        auVar73._8_4_ = 0x3f800000;
        auVar73._0_8_ = &DAT_3f8000003f800000;
        auVar73._12_4_ = 0x3f800000;
        uVar5 = vmovlps_avx(auVar73);
        left.max_time_range.upper = (float)uVar5;
        left.time_range.lower = (float)((ulong)uVar5 >> 0x20);
        left.time_range.upper = 0.0;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [0] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [1] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [2] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [3] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [0] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [1] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
             -INFINITY;
        right.max_time_range.lower = 0.0;
        right.object_range._begin = 0;
        right.object_range._end = 0;
        right.num_time_segments = 0;
        right.max_num_time_segments = 0;
        uVar5 = vmovlps_avx(auVar73);
        right.max_time_range.upper = (float)uVar5;
        right.time_range.lower = (float)((ulong)uVar5 >> 0x20);
        right.time_range.upper = 0.0;
        vSplitPos.field_0.i[1] = *(undefined4 *)((long)local_1718 + lVar37 + 8);
        vSplitPos.field_0.i[0] = vSplitPos.field_0.i[1];
        vSplitPos.field_0.i[3] = vSplitPos.field_0.i[1];
        vSplitPos.field_0.i[2] = vSplitPos.field_0.i[1];
        lVar38 = (long)(1 << (*(byte *)((long)local_1718 + lVar37 + 4) & 0x1f)) * 0x10;
        vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar38);
        vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar38 + 8);
        isLeft.split = pSVar3;
        isLeft.vSplitPos = &vSplitPos;
        isLeft.vSplitMask = &vSplitMask;
        BStack_1ba0 = (BBox1f)parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                        (*(PrimRefMB **)((long)local_1728[uVar52 * 0x1e] + 0x20),
                                         (size_t)local_1ba8,(size_t)BVar9,(EmptyTy *)local_19d8,
                                         &left,&right,&isLeft,&reduction,&reduction2,0x80,0xc00);
        local_1b78 = local_1728[uVar52 * 0x1e];
        auVar55._8_8_ = 0;
        auVar55._0_4_ = local_1728[uVar52 * 0x1e + -1].lower;
        auVar55._4_4_ = local_1728[uVar52 * 0x1e + -1].upper;
        local_1bc8.upper =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1];
        local_1bc8.lower =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0];
        sStack_1bc0 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                               field_0.m128[3],
                               left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                               field_0.m128[2]);
        sStack_1bb8 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                               field_0.m128[1],
                               left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                               field_0.m128[0]);
        BStack_1bb0.upper =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3];
        BStack_1bb0.lower =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2];
        lbbox_1.bounds0.upper.field_0._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        lbbox_1.bounds0.upper.field_0._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        lbbox_1.bounds1.lower.field_0._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _0_8_;
        lbbox_1.bounds1.lower.field_0._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _8_8_;
        lbbox_1.bounds1.upper.field_0._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _0_8_;
        lbbox_1.bounds1.upper.field_0._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _8_8_;
        aStack_1bd8._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _0_8_;
        aStack_1bd8._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _8_8_;
        sStack_1b98 = left.num_time_segments;
        sStack_1b90 = left.max_num_time_segments;
        auStack_1b88._0_8_ = CONCAT44(left.max_time_range.upper,left.max_time_range.lower);
        auStack_1b88._8_8_ = SUB168(auStack_1b88,8);
        auVar62._8_8_ = 0;
        auVar62._0_8_ = auStack_1b88._8_8_;
        auVar56 = vcmpps_avx(auVar62,auVar55,1);
        auVar58 = vinsertps_avx(auVar55,auVar62,0x50);
        auVar57 = vinsertps_avx(auVar62,auVar55,0x50);
        auVar56 = vblendvps_avx(auVar57,auVar58,auVar56);
        uVar5 = vmovlps_avx(auVar56);
        auStack_1b88._0_8_ = SUB168(auStack_1b88,0);
        auStack_1b88._8_8_ = uVar5;
        local_1b08._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        local_1b08._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        aStack_1af8.m128[3] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             m128[3];
        aStack_1af8.m128[2] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             m128[2];
        aStack_1af8._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _0_8_;
        local_1ae8.m128[1] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[1];
        local_1ae8.m128[0] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[0];
        local_1ae8.m128[3] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[3];
        local_1ae8.m128[2] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[2];
        uStack_1ad8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[0]);
        uStack_1ad0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[2]);
        local_1ac8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[1],
                              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[0]);
        uStack_1ac0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[2]);
        uStack_1ab8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[0]);
        uStack_1ab0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[2]);
        sStack_1a98 = right.num_time_segments;
        sStack_1a90 = right.max_num_time_segments;
        auStack_1a88._0_8_ = CONCAT44(right.max_time_range.upper,right.max_time_range.lower);
        auStack_1a88._8_8_ = SUB168(auStack_1a88,8);
        auVar63._8_8_ = 0;
        auVar63._0_8_ = auStack_1a88._8_8_;
        auVar56 = vcmpps_avx(auVar63,auVar55,1);
        auVar58 = vinsertps_avx(auVar55,auVar63,0x50);
        auVar57 = vinsertps_avx(auVar63,auVar55,0x50);
        auVar56 = vblendvps_avx(auVar57,auVar58,auVar56);
        uVar5 = vmovlps_avx(auVar56);
        auStack_1a88._0_8_ = SUB168(auStack_1a88,0);
        auStack_1a88._8_8_ = uVar5;
        local_1aa8 = BStack_1ba0;
        BStack_1aa0 = BVar9;
        local_1a78 = local_1b78;
LAB_014306c0:
        new_vector._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      }
      else {
        this_00 = (SetMB *)((long)&lbbox + lVar37 + 0x10);
        if (iVar6 != 2) {
          if (iVar6 == 1) {
            SetMB::deterministic_order(this_00);
            splitFallback(this,this_00,(SetMB *)&lbbox_1.bounds0.upper,(SetMB *)&local_1b08.field_1)
            ;
          }
          else if (iVar6 == 3) {
            SetMB::deterministic_order(this_00);
            splitByGeometry(this,this_00,(SetMB *)&lbbox_1.bounds0.upper,
                            (SetMB *)&local_1b08.field_1);
          }
          goto LAB_014306c0;
        }
        time_range1.lower = *(float *)((long)local_1718 + lVar37 + 8);
        time_range0.lower = local_1728[uVar52 * 0x1e + -1].lower;
        time_range1.upper = local_1728[uVar52 * 0x1e + -1].upper;
        BVar9 = local_1728[uVar52 * 0x1e];
        time_range0.upper = time_range1.lower;
        local_1b78 = (BBox1f)operator_new(0x28);
        pMVar10 = (this->heuristicTemporalSplit).device;
        BVar11 = local_1758[uVar52 * 0x1e + 1];
        *(MemoryMonitorInterface **)local_1b78 = pMVar10;
        *(undefined1 *)((long)local_1b78 + 8) = 0;
        *(long *)((long)local_1b78 + 0x10) = 0;
        *(long *)((long)local_1b78 + 0x18) = 0;
        *(long *)((long)local_1b78 + 0x20) = 0;
        lVar38 = (long)BVar11 - (long)local_1758[uVar52 * 0x1e];
        if (lVar38 != 0) {
          uVar51 = lVar38 * 0x50;
          (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,uVar51,0);
          if (uVar51 < 0x1c00000) {
            pvVar39 = alignedMalloc(uVar51,0x10);
          }
          else {
            pvVar39 = os_malloc(uVar51,(bool *)((long)local_1b78 + 8));
          }
          *(void **)((long)local_1b78 + 0x20) = pvVar39;
          *(long *)((long)local_1b78 + 0x10) = lVar38;
          *(long *)((long)local_1b78 + 0x18) = lVar38;
        }
        pvVar33 = isLeft.vSplitPos;
        vSplitMask.field_0._0_4_ = BVar9.lower;
        vSplitMask.field_0._4_4_ = BVar9.upper;
        vSplitMask.field_0._8_8_ = &time_range0;
        BVar11 = local_1758[uVar52 * 0x1e];
        BVar12 = local_1758[uVar52 * 0x1e + 1];
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [0] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [1] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [2] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [3] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [0] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [1] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
             -INFINITY;
        right.max_time_range.lower = 0.0;
        right.object_range._begin = 0;
        right.object_range._end = 0;
        right.num_time_segments = 0;
        right.max_num_time_segments = 0;
        auVar56._8_4_ = 0x3f800000;
        auVar56._0_8_ = &DAT_3f8000003f800000;
        auVar56._12_4_ = 0x3f800000;
        uVar5 = vmovlps_avx(auVar56);
        right.max_time_range.upper = (float)uVar5;
        right.time_range.lower = (float)((ulong)uVar5 >> 0x20);
        right.time_range.upper = 0.0;
        new_vector._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
                )local_1b78;
        if ((ulong)((long)BVar12 - (long)BVar11) < 0xc00) {
          isLeft.split = (Split *)BVar11;
          isLeft.vSplitPos = (vint *)BVar12;
          ::anon_func::anon_class_40_5_808acc65::operator()
                    (&left,(anon_class_40_5_808acc65 *)&vSplitMask,(range<unsigned_long> *)&isLeft);
        }
        else {
          isLeft.vSplitPos._6_2_ = SUB82(pvVar33,6);
          isLeft.vSplitPos._0_6_ = CONCAT15(4,CONCAT14(1,isLeft.vSplitPos._0_4_));
          tbb::detail::r1::initialize((task_group_context *)&isLeft);
          _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          vSplitPos.field_0.v[0] = (longlong)BVar12;
          vSplitPos.field_0.v[1] = (longlong)BVar11;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    (&left,(d1 *)&vSplitPos,(blocked_range<unsigned_long> *)&right,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                     (anon_class_16_2_ed117de8_conflict29 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&isLeft,
                     (task_group_context *)
                     new_vector._M_t.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl);
          cVar36 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
          if (cVar36 != '\0') {
            prVar44 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar44,"task cancelled");
            __cxa_throw(prVar44,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&isLeft);
        }
        if (left.object_range._end - left.object_range._begin !=
            (long)local_1758[uVar52 * 0x1e + 1] - (long)local_1758[uVar52 * 0x1e]) {
          right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
          _0_8_ = &time_range0;
          left.object_range._end =
               parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                         (*(PrimRefMB **)((long)local_1b78 + 0x20),0,
                          (long)local_1758[uVar52 * 0x1e + 1] - (long)local_1758[uVar52 * 0x1e],
                          0x400,(anon_class_8_1_41ce32a5 *)&right);
        }
        uVar5 = vSplitPos.field_0.v[1];
        auVar57._4_4_ = time_range0.upper;
        auVar57._0_4_ = time_range0.lower;
        auVar57._8_8_ = 0;
        local_1bc8.upper =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1];
        local_1bc8.lower =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0];
        sStack_1bc0 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                               field_0.m128[3],
                               left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                               field_0.m128[2]);
        sStack_1bb8 = CONCAT44(left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                               field_0.m128[1],
                               left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
                               field_0.m128[0]);
        BStack_1bb0.upper =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3];
        BStack_1bb0.lower =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2];
        sStack_1b98 = left.num_time_segments;
        sStack_1b90 = left.max_num_time_segments;
        lbbox_1.bounds0.upper.field_0._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        lbbox_1.bounds0.upper.field_0._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        lbbox_1.bounds1.lower.field_0._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _0_8_;
        lbbox_1.bounds1.lower.field_0._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _8_8_;
        lbbox_1.bounds1.upper.field_0._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _0_8_;
        lbbox_1.bounds1.upper.field_0._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             _8_8_;
        aStack_1bd8._0_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _0_8_;
        aStack_1bd8._8_8_ =
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _8_8_;
        local_1ba8.lower = (float)(undefined4)left.object_range._begin;
        local_1ba8.upper = (float)left.object_range._begin._4_4_;
        BStack_1ba0.lower = (float)(undefined4)left.object_range._end;
        BStack_1ba0.upper = (float)left.object_range._end._4_4_;
        auVar64._4_4_ = left.max_time_range.upper;
        auVar64._0_4_ = left.max_time_range.lower;
        auVar64._8_8_ = 0;
        auVar68._4_4_ = left.time_range.upper;
        auVar68._0_4_ = left.time_range.lower;
        auVar68._8_8_ = 0;
        auVar56 = vcmpps_avx(auVar68,auVar57,1);
        auVar58 = vinsertps_avx(auVar57,auVar68,0x50);
        auVar57 = vinsertps_avx(auVar68,auVar57,0x50);
        auVar56 = vblendvps_avx(auVar57,auVar58,auVar56);
        auStack_1b88 = vmovlhps_avx(auVar64,auVar56);
        BVar11 = local_1758[uVar52 * 0x1e + 1];
        isLeft.split = (Split *)0x7f8000007f800000;
        isLeft.vSplitPos = (vint *)0x7f8000007f800000;
        isLeft.vSplitMask = (vbool *)0xff800000ff800000;
        auVar58._8_4_ = 0x3f800000;
        auVar58._0_8_ = &DAT_3f8000003f800000;
        auVar58._12_4_ = 0x3f800000;
        vmovlps_avx(auVar58);
        _reduction2 = BVar9;
        if ((ulong)((long)BVar11 - (long)local_1758[uVar52 * 0x1e]) < 0xc00) {
          vSplitPos.field_0.v[0] = (longlong)local_1758[uVar52 * 0x1e];
          vSplitPos.field_0.v[1] = (longlong)BVar11;
          ::anon_func::anon_class_24_3_35f68c7c::operator()
                    (&right,(anon_class_24_3_35f68c7c *)&reduction2,
                     (range<unsigned_long> *)&vSplitPos);
        }
        else {
          vSplitPos.field_0.v[1]._4_1_ = 1;
          vSplitPos.field_0.v[1]._6_2_ = SUB82(uVar5,6);
          vSplitPos.field_0.v[1]._5_1_ = 4;
          tbb::detail::r1::initialize((task_group_context *)&vSplitPos);
          local_19d8._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          local_19d8._8_8_ = &reduction2;
          _reduction = (code *)BVar11;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    (&right,(d1 *)&reduction,(blocked_range<unsigned_long> *)&isLeft,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_19d8,
                     (anon_class_16_2_ed117de8_conflict30 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&vSplitPos,
                     (task_group_context *)
                     new_vector._M_t.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl);
          cVar36 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
          if (cVar36 != '\0') {
            prVar44 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar44,"task cancelled");
            __cxa_throw(prVar44,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&vSplitPos);
        }
        lVar38 = right.object_range._end - right.object_range._begin;
        right.object_range._begin = *(unsigned_long *)(local_1758 + uVar52 * 0x1e);
        right.object_range._end = lVar38 + right.object_range._begin;
        if (lVar38 != (long)local_1758[uVar52 * 0x1e + 1] - right.object_range._begin) {
          isLeft.split = (Split *)&time_range1;
          right.object_range._end =
               parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                         (*(PrimRefMB **)((long)BVar9 + 0x20),right.object_range._begin,
                          (unsigned_long)local_1758[uVar52 * 0x1e + 1],0x400,
                          (anon_class_8_1_41ce32a6 *)&isLeft);
        }
        auVar59._4_4_ = time_range1.upper;
        auVar59._0_4_ = time_range1.lower;
        auVar59._8_8_ = 0;
        aStack_1af8.m128[3] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             m128[3];
        aStack_1af8.m128[2] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             m128[2];
        local_1ae8.m128[1] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[1];
        local_1ae8.m128[0] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[0];
        local_1ae8.m128[3] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[3];
        local_1ae8.m128[2] =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
             m128[2];
        uStack_1ad8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[0]);
        uStack_1ad0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[2]);
        local_1ac8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[1],
                              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[0]);
        uStack_1ac0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[2]);
        uStack_1ab8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[0]);
        uStack_1ab0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[2]);
        sStack_1a90 = right.max_num_time_segments;
        sStack_1a98 = right.num_time_segments;
        local_1b08._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        local_1b08._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        aStack_1af8._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
             _0_8_;
        local_1aa8.lower = (float)(undefined4)right.object_range._begin;
        local_1aa8.upper = (float)right.object_range._begin._4_4_;
        BStack_1aa0.lower = (float)(undefined4)right.object_range._end;
        BStack_1aa0.upper = (float)right.object_range._end._4_4_;
        auVar65._4_4_ = right.time_range.upper;
        auVar65._0_4_ = right.time_range.lower;
        auVar65._8_8_ = 0;
        auVar56 = vcmpps_avx(auVar65,auVar59,1);
        auVar58 = vinsertps_avx(auVar59,auVar65,0x50);
        auVar57 = vinsertps_avx(auVar65,auVar59,0x50);
        auVar56 = vblendvps_avx(auVar57,auVar58,auVar56);
        auVar66._4_4_ = right.max_time_range.upper;
        auVar66._0_4_ = right.max_time_range.lower;
        auVar66._8_8_ = 0;
        auStack_1a88 = vmovlhps_avx(auVar66,auVar56);
        local_1a78 = BVar9;
      }
      auVar56 = auStack_1b88;
      bVar54 = (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )new_vector._M_t.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl !=
               (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      findFallback((Split *)&left,this,(SetMB *)&lbbox_1.bounds0.upper);
      uVar5 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
              _0_8_;
      uVar18 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
               _8_8_;
      uVar19 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.
               _0_8_;
      uVar20 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
               _0_8_;
      uVar21 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.
               _8_8_;
      uVar22 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
               _0_8_;
      uVar32 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
               _8_8_;
      findFallback((Split *)&left,this,(SetMB *)&local_1b08.field_1);
      lVar38 = local_640;
      local_1a68 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_;
      uStack_1a60 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._8_8_;
      local_1a58 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                   field_0._0_8_;
      local_1a48 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                   field_0._0_8_;
      uStack_1a40 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                    field_0._8_8_;
      uStack_1a38 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0._0_8_;
      uStack_1a30 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
                    field_0._8_8_;
      new_vector._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              )0x0;
      pBVar45 = local_8c8[uVar52];
      if (local_1b78 == *pBVar45) {
        pBVar45[1] = (BBox1f)((long)pBVar45[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        local_838[lVar38 * 2 + -1] = local_1b78;
        local_838[lVar38 * 2].lower = 1.4013e-45;
        local_838[lVar38 * 2].upper = 0.0;
        local_8c8[uVar52] = local_838 + lVar38 * 2 + -1;
      }
      lVar38 = local_640;
      if (local_1a78 == *pBVar45) {
        local_8c8[local_848] = pBVar45;
        pBVar45[1] = (BBox1f)((long)pBVar45[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        local_838[lVar38 * 2 + -1] = local_1a78;
        local_838[lVar38 * 2].lower = 1.4013e-45;
        local_838[lVar38 * 2].upper = 0.0;
        local_8c8[local_848] = local_838 + lVar38 * 2 + -1;
      }
      pBVar16 = pBVar45 + 1;
      *pBVar16 = (BBox1f)((long)*pBVar16 + -1);
      if ((*pBVar16 == (BBox1f)0x0) && (BVar9 = *pBVar45, BVar9 != (BBox1f)0x0)) {
        lVar38 = *(undefined8 *)((long)BVar9 + 0x18);
        pvVar39 = *(void **)((long)BVar9 + 0x20);
        if (pvVar39 != (void *)0x0) {
          if ((ulong)(lVar38 * 0x50) < 0x1c00000) {
            alignedFree(pvVar39);
          }
          else {
            os_free(pvVar39,lVar38 * 0x50,*(bool *)((long)BVar9 + 8));
          }
        }
        if (lVar38 != 0) {
          (**(code **)**(undefined8 **)BVar9)(*(undefined8 **)BVar9,lVar38 * -0x50,1);
        }
        *(undefined8 *)((long)BVar9 + 0x10) = 0;
        *(undefined8 *)((long)BVar9 + 0x18) = 0;
        *(undefined8 *)((long)BVar9 + 0x20) = 0;
        operator_delete((void *)BVar9);
      }
      uVar51 = local_848;
      auVar58 = auStack_1a88;
      VVar31.field_0 =
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0;
      *(undefined8 *)((long)&lbbox + lVar37) = lbbox_1.bounds0.lower.field_0._0_8_;
      *(undefined8 *)((long)&lbbox + lVar37 + 0x10) = lbbox_1.bounds0.upper.field_0._0_8_;
      *(undefined8 *)((long)&lbbox + lVar37 + 0x18) = lbbox_1.bounds0.upper.field_0._8_8_;
      *(undefined8 *)((long)&lbbox + lVar37 + 0x20) = lbbox_1.bounds1.lower.field_0._0_8_;
      *(undefined8 *)((long)&lbbox + lVar37 + 0x28) = lbbox_1.bounds1.lower.field_0._8_8_;
      *(undefined8 *)((long)&lbbox + lVar37 + 0x30) = lbbox_1.bounds1.upper.field_0._0_8_;
      *(undefined8 *)((long)&lbbox + lVar37 + 0x38) = lbbox_1.bounds1.upper.field_0._8_8_;
      ((BBox1f *)(local_1788 + uVar52 * 0xf0))->lower = (float)aStack_1bd8._0_4_;
      ((BBox1f *)(local_1788 + uVar52 * 0xf0))->upper = aStack_1bd8.m128[1];
      ((BBox1f *)(local_1788 + lVar37 + 8))->lower = (float)aStack_1bd8._8_4_;
      ((BBox1f *)(local_1788 + lVar37 + 8))->upper = aStack_1bd8.m128[3];
      *(BBox1f *)(&local_1778 + uVar52 * 0xf) = local_1bc8;
      *(size_t *)((long)&local_1778 + lVar37 + 8) = sStack_1bc0;
      *(size_t *)(local_1768 + uVar52 * 0xf0) = sStack_1bb8;
      *(BBox1f *)(local_1768 + lVar37 + 8) = BStack_1bb0;
      local_1758[uVar52 * 0x1e] = local_1ba8;
      local_1758[uVar52 * 0x1e + 1] = BStack_1ba0;
      asStack_1748[uVar52 * 0x1e] = sStack_1b98;
      asStack_1748[uVar52 * 0x1e + 1] = sStack_1b90;
      (&local_1738)[uVar52 * 0x1e].lower = (float)auStack_1b88._0_4_;
      (&local_1738)[uVar52 * 0x1e].upper = (float)auStack_1b88._4_4_;
      local_1728[uVar52 * 0x1e + -1].lower = (float)auStack_1b88._8_4_;
      local_1728[uVar52 * 0x1e + -1].upper = (float)auStack_1b88._12_4_;
      *(BBox1f *)&local_1728[uVar52 * 0x1e].lower = local_1b78;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_4_ =
           (undefined4)uVar5;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._4_4_ =
           SUB84(uVar5,4);
      pSVar3->sah = (float)left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                           lower.field_0._0_4_;
      pSVar3->dim = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._4_4_;
      *(undefined8 *)((long)local_1718 + lVar37 + 8) = uVar18;
      *(undefined8 *)((long)local_1718 + lVar37 + 0x10) = uVar19;
      *(undefined8 *)((long)local_1718 + lVar37 + 0x20) = uVar20;
      *(undefined8 *)((long)local_1718 + lVar37 + 0x28) = uVar21;
      *(undefined8 *)((long)local_1718 + lVar37 + 0x30) = uVar22;
      *(undefined8 *)((long)local_1718 + lVar37 + 0x38) = uVar32;
      lVar37 = local_848 * 0xf0;
      *(undefined8 *)((long)&lbbox + lVar37) = local_1b18._0_8_;
      *(undefined8 *)((long)&lbbox + lVar37 + 0x10) = local_1b08._0_8_;
      *(undefined8 *)((long)&lbbox + lVar37 + 0x18) = local_1b08._8_8_;
      *(undefined8 *)((long)&lbbox + lVar37 + 0x20) = aStack_1af8._0_8_;
      *(undefined8 *)((long)&lbbox + lVar37 + 0x28) = aStack_1af8._8_8_;
      *(undefined8 *)((long)&lbbox + lVar37 + 0x30) = local_1ae8._0_8_;
      *(undefined8 *)((long)&lbbox + lVar37 + 0x38) = local_1ae8._8_8_;
      *(undefined8 *)(local_1788 + uVar51 * 0xf0) = uStack_1ad8;
      *(undefined8 *)(local_1788 + lVar37 + 8) = uStack_1ad0;
      *(undefined8 *)(&local_1778 + uVar51 * 0xf) = local_1ac8;
      *(undefined8 *)((long)&local_1778 + lVar37 + 8) = uStack_1ac0;
      *(undefined8 *)(local_1768 + uVar51 * 0xf0) = uStack_1ab8;
      *(undefined8 *)(local_1768 + lVar37 + 8) = uStack_1ab0;
      local_1758[uVar51 * 0x1e] = local_1aa8;
      local_1758[uVar51 * 0x1e + 1] = BStack_1aa0;
      asStack_1748[uVar51 * 0x1e] = sStack_1a98;
      asStack_1748[uVar51 * 0x1e + 1] = sStack_1a90;
      (&local_1738)[uVar51 * 0x1e].lower = (float)auStack_1a88._0_4_;
      (&local_1738)[uVar51 * 0x1e].upper = (float)auStack_1a88._4_4_;
      local_1728[uVar51 * 0x1e + -1].lower = (float)auStack_1a88._8_4_;
      local_1728[uVar51 * 0x1e + -1].upper = (float)auStack_1a88._12_4_;
      local_1728[uVar51 * 0x1e] = local_1a78;
      *(undefined8 *)((long)local_1718 + lVar37) = local_1a68;
      *(undefined8 *)((long)local_1718 + lVar37 + 8) = uStack_1a60;
      *(undefined8 *)((long)local_1718 + lVar37 + 0x10) = local_1a58;
      *(undefined8 *)((long)local_1718 + lVar37 + 0x20) = local_1a48;
      *(undefined8 *)((long)local_1718 + lVar37 + 0x28) = uStack_1a40;
      *(undefined8 *)((long)local_1718 + lVar37 + 0x30) = uStack_1a38;
      *(undefined8 *)((long)local_1718 + lVar37 + 0x38) = uStack_1a30;
      local_848 = local_848 + 1;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0 =
           VVar31.field_0;
      auStack_1a88 = auVar58;
      if ((__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )new_vector._M_t.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )0x0) {
        std::
        default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
        ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                      *)&new_vector,
                     (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                      *)new_vector._M_t.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl);
      }
      bVar49 = bVar49 | bVar54;
      auStack_1b88 = auVar56;
    }
  } while ((uVar52 != 0xffffffffffffffff) && (local_848 < (this->cfg).branchingFactor));
  if (local_848 != 0) {
    puVar53 = &uStack_172c;
    uVar40 = local_848;
    do {
      auVar56 = vcmpps_avx(ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.lower),
                           ZEXT416(puVar53[-1]),1);
      auVar58 = vcmpps_avx(ZEXT416(*puVar53),
                           ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.upper),1);
      auVar56 = vorps_avx(auVar56,auVar58);
      bVar49 = bVar49 | auVar56[0];
      puVar53 = puVar53 + 0x3c;
      uVar40 = uVar40 - 1;
    } while (uVar40 != 0);
  }
  if ((bVar49 & 1) == 0) {
    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0xe0;
    pTVar13 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar13->alloc)._M_b._M_p) {
      local_1b18._8_1_ = 1;
      local_1b18._0_8_ = pTVar13;
      MutexSys::lock(&pTVar13->mutex);
      if ((pTVar13->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar13->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar13->alloc1).bytesUsed + (pTVar13->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar13->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar13->alloc0).end + (pTVar13->alloc1).end) -
             ((pTVar13->alloc0).cur + (pTVar13->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar13->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar13->alloc1).bytesWasted + (pTVar13->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar61 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar13->alloc0).end = auVar61._0_8_;
      (pTVar13->alloc0).allocBlockSize = auVar61._8_8_;
      (pTVar13->alloc0).bytesUsed = auVar61._16_8_;
      (pTVar13->alloc0).bytesWasted = auVar61._24_8_;
      (pTVar13->alloc0).ptr = (char *)auVar61._0_8_;
      (pTVar13->alloc0).cur = auVar61._8_8_;
      (pTVar13->alloc0).end = auVar61._16_8_;
      (pTVar13->alloc0).allocBlockSize = auVar61._24_8_;
      auVar61 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar13->alloc1).end = auVar61._0_8_;
        (pTVar13->alloc1).allocBlockSize = auVar61._8_8_;
        (pTVar13->alloc1).bytesUsed = auVar61._16_8_;
        (pTVar13->alloc1).bytesWasted = auVar61._24_8_;
        (pTVar13->alloc1).ptr = (char *)auVar61._0_8_;
        (pTVar13->alloc1).cur = auVar61._8_8_;
        (pTVar13->alloc1).end = auVar61._16_8_;
        (pTVar13->alloc1).allocBlockSize = auVar61._24_8_;
      }
      else {
        (pTVar13->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar13->alloc1).ptr = (char *)auVar61._0_8_;
        (pTVar13->alloc1).cur = auVar61._8_8_;
        (pTVar13->alloc1).end = auVar61._16_8_;
        (pTVar13->alloc1).allocBlockSize = auVar61._24_8_;
        (pTVar13->alloc1).end = auVar61._0_8_;
        (pTVar13->alloc1).allocBlockSize = auVar61._8_8_;
        (pTVar13->alloc1).bytesUsed = auVar61._16_8_;
        (pTVar13->alloc1).bytesWasted = auVar61._24_8_;
        (pTVar13->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar13->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           pTVar13;
      lbbox_1.bounds0.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      lbbox_1.bounds0.lower.field_0._8_1_ = 1;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar14._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar14._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar14,(ThreadLocal2 **)&left);
      }
      else {
        *iVar14._M_current =
             (ThreadLocal2 *)
             left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      if (lbbox_1.bounds0.lower.field_0._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)lbbox_1.bounds0.lower.field_0._0_8_);
      }
      if (local_1b18._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)local_1b18._0_8_);
      }
    }
    (alloc.talloc0)->bytesUsed =
         (alloc.talloc0)->bytesUsed +
         right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
    ;
    sVar42 = (alloc.talloc0)->cur;
    uVar40 = (ulong)(-(int)sVar42 & 0xf);
    uVar52 = sVar42 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0._0_8_ + uVar40;
    (alloc.talloc0)->cur = uVar52;
    if ((alloc.talloc0)->end < uVar52) {
      (alloc.talloc0)->cur = sVar42;
      if ((alloc.talloc0)->allocBlockSize <
          (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_ << 2)) {
        pcVar50 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
      }
      else {
        lbbox_1.bounds0.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar50 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox_1);
        (alloc.talloc0)->ptr = pcVar50;
        sVar42 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar42;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = lbbox_1.bounds0.lower.field_0._0_8_;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)lbbox_1.bounds0.lower.field_0._0_8_ <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          lbbox_1.bounds0.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
          pcVar50 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox_1);
          (alloc.talloc0)->ptr = pcVar50;
          sVar42 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar42;
          (alloc.talloc0)->cur = 0;
          (alloc.talloc0)->end = lbbox_1.bounds0.lower.field_0._0_8_;
          (alloc.talloc0)->cur =
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_;
          if ((ulong)lbbox_1.bounds0.lower.field_0._0_8_ <
              (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar50 = (char *)0x0;
            goto LAB_014317a4;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar42;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar40;
      pcVar50 = (alloc.talloc0)->ptr +
                (uVar52 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          lower.field_0._0_8_);
    }
LAB_014317a4:
    uVar40 = 1;
    goto LAB_014317a9;
  }
  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       0x100;
  pTVar13 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar13->alloc)._M_b._M_p) {
    local_1b18._8_1_ = 1;
    local_1b18._0_8_ = pTVar13;
    MutexSys::lock(&pTVar13->mutex);
    if ((pTVar13->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((pTVar13->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar13->alloc1).bytesUsed + (pTVar13->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar13->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar13->alloc0).end + (pTVar13->alloc1).end) -
           ((pTVar13->alloc0).cur + (pTVar13->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar13->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar13->alloc1).bytesWasted + (pTVar13->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar61 = ZEXT1632(ZEXT816(0) << 0x40);
    (pTVar13->alloc0).end = auVar61._0_8_;
    (pTVar13->alloc0).allocBlockSize = auVar61._8_8_;
    (pTVar13->alloc0).bytesUsed = auVar61._16_8_;
    (pTVar13->alloc0).bytesWasted = auVar61._24_8_;
    (pTVar13->alloc0).ptr = (char *)auVar61._0_8_;
    (pTVar13->alloc0).cur = auVar61._8_8_;
    (pTVar13->alloc0).end = auVar61._16_8_;
    (pTVar13->alloc0).allocBlockSize = auVar61._24_8_;
    auVar61 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar13->alloc1).end = auVar61._0_8_;
      (pTVar13->alloc1).allocBlockSize = auVar61._8_8_;
      (pTVar13->alloc1).bytesUsed = auVar61._16_8_;
      (pTVar13->alloc1).bytesWasted = auVar61._24_8_;
      (pTVar13->alloc1).ptr = (char *)auVar61._0_8_;
      (pTVar13->alloc1).cur = auVar61._8_8_;
      (pTVar13->alloc1).end = auVar61._16_8_;
      (pTVar13->alloc1).allocBlockSize = auVar61._24_8_;
    }
    else {
      (pTVar13->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar13->alloc1).ptr = (char *)auVar61._0_8_;
      (pTVar13->alloc1).cur = auVar61._8_8_;
      (pTVar13->alloc1).end = auVar61._16_8_;
      (pTVar13->alloc1).allocBlockSize = auVar61._24_8_;
      (pTVar13->alloc1).end = auVar61._0_8_;
      (pTVar13->alloc1).allocBlockSize = auVar61._8_8_;
      (pTVar13->alloc1).bytesUsed = auVar61._16_8_;
      (pTVar13->alloc1).bytesWasted = auVar61._24_8_;
      (pTVar13->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar13->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         pTVar13;
    lbbox_1.bounds0.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    lbbox_1.bounds0.lower.field_0._8_1_ = 1;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar14._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar14._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar14,(ThreadLocal2 **)&left);
    }
    else {
      *iVar14._M_current =
           (ThreadLocal2 *)
           left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if (lbbox_1.bounds0.lower.field_0._8_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)lbbox_1.bounds0.lower.field_0._0_8_);
    }
    if (local_1b18._8_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)local_1b18._0_8_);
    }
  }
  (alloc.talloc0)->bytesUsed =
       (alloc.talloc0)->bytesUsed +
       right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
  sVar42 = (alloc.talloc0)->cur;
  uVar40 = (ulong)(-(int)sVar42 & 0xf);
  uVar52 = sVar42 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._0_8_ + uVar40;
  (alloc.talloc0)->cur = uVar52;
  if ((alloc.talloc0)->end < uVar52) {
    (alloc.talloc0)->cur = sVar42;
    if ((alloc.talloc0)->allocBlockSize <
        (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_ << 2)) {
      pcVar50 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
    }
    else {
      lbbox_1.bounds0.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
      pcVar50 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox_1);
      (alloc.talloc0)->ptr = pcVar50;
      sVar42 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar42;
      (alloc.talloc0)->cur = 0;
      (alloc.talloc0)->end = lbbox_1.bounds0.lower.field_0._0_8_;
      (alloc.talloc0)->cur =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      if ((ulong)lbbox_1.bounds0.lower.field_0._0_8_ <
          (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        lbbox_1.bounds0.lower.field_0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar50 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&lbbox_1);
        (alloc.talloc0)->ptr = pcVar50;
        sVar42 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar42;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = lbbox_1.bounds0.lower.field_0._0_8_;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)lbbox_1.bounds0.lower.field_0._0_8_ <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar50 = (char *)0x0;
          goto LAB_014316fe;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar42;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar40;
    pcVar50 = (alloc.talloc0)->ptr +
              (uVar52 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                        lower.field_0._0_8_);
  }
LAB_014316fe:
  pcVar50[0xe0] = '\0';
  pcVar50[0xe1] = '\0';
  pcVar50[0xe2] = -0x80;
  pcVar50[0xe3] = '\x7f';
  pcVar50[0xe4] = '\0';
  pcVar50[0xe5] = '\0';
  pcVar50[0xe6] = -0x80;
  pcVar50[0xe7] = '\x7f';
  pcVar50[0xe8] = '\0';
  pcVar50[0xe9] = '\0';
  pcVar50[0xea] = -0x80;
  pcVar50[0xeb] = '\x7f';
  pcVar50[0xec] = '\0';
  pcVar50[0xed] = '\0';
  pcVar50[0xee] = -0x80;
  pcVar50[0xef] = '\x7f';
  pcVar50[0xf0] = '\0';
  pcVar50[0xf1] = '\0';
  pcVar50[0xf2] = -0x80;
  pcVar50[0xf3] = -1;
  pcVar50[0xf4] = '\0';
  pcVar50[0xf5] = '\0';
  pcVar50[0xf6] = -0x80;
  pcVar50[0xf7] = -1;
  pcVar50[0xf8] = '\0';
  pcVar50[0xf9] = '\0';
  pcVar50[0xfa] = -0x80;
  pcVar50[0xfb] = -1;
  pcVar50[0xfc] = '\0';
  pcVar50[0xfd] = '\0';
  pcVar50[0xfe] = -0x80;
  pcVar50[0xff] = -1;
  uVar40 = 6;
LAB_014317a9:
  pcVar50[0x60] = '\0';
  pcVar50[0x61] = '\0';
  pcVar50[0x62] = -0x80;
  pcVar50[99] = '\x7f';
  pcVar50[100] = '\0';
  pcVar50[0x65] = '\0';
  pcVar50[0x66] = -0x80;
  pcVar50[0x67] = '\x7f';
  pcVar50[0x68] = '\0';
  pcVar50[0x69] = '\0';
  pcVar50[0x6a] = -0x80;
  pcVar50[0x6b] = '\x7f';
  pcVar50[0x6c] = '\0';
  pcVar50[0x6d] = '\0';
  pcVar50[0x6e] = -0x80;
  pcVar50[0x6f] = '\x7f';
  pcVar50[0x40] = '\0';
  pcVar50[0x41] = '\0';
  pcVar50[0x42] = -0x80;
  pcVar50[0x43] = '\x7f';
  pcVar50[0x44] = '\0';
  pcVar50[0x45] = '\0';
  pcVar50[0x46] = -0x80;
  pcVar50[0x47] = '\x7f';
  pcVar50[0x48] = '\0';
  pcVar50[0x49] = '\0';
  pcVar50[0x4a] = -0x80;
  pcVar50[0x4b] = '\x7f';
  pcVar50[0x4c] = '\0';
  pcVar50[0x4d] = '\0';
  pcVar50[0x4e] = -0x80;
  pcVar50[0x4f] = '\x7f';
  pcVar50[0x20] = '\0';
  pcVar50[0x21] = '\0';
  pcVar50[0x22] = -0x80;
  pcVar50[0x23] = '\x7f';
  pcVar50[0x24] = '\0';
  pcVar50[0x25] = '\0';
  pcVar50[0x26] = -0x80;
  pcVar50[0x27] = '\x7f';
  pcVar50[0x28] = '\0';
  pcVar50[0x29] = '\0';
  pcVar50[0x2a] = -0x80;
  pcVar50[0x2b] = '\x7f';
  pcVar50[0x2c] = '\0';
  pcVar50[0x2d] = '\0';
  pcVar50[0x2e] = -0x80;
  pcVar50[0x2f] = '\x7f';
  local_1e08._8_4_ = 0xff800000;
  local_1e08._0_8_ = 0xff800000ff800000;
  local_1e08._12_4_ = 0xff800000;
  *(undefined1 (*) [16])(pcVar50 + 0x70) = local_1e08;
  *(undefined1 (*) [16])(pcVar50 + 0x50) = local_1e08;
  *(undefined1 (*) [16])(pcVar50 + 0x30) = local_1e08;
  auVar56 = ZEXT816(0) << 0x40;
  *(undefined1 (*) [32])(pcVar50 + 0x80) = ZEXT1632(auVar56);
  *(undefined1 (*) [32])(pcVar50 + 0xa0) = ZEXT1632(auVar56);
  *(undefined1 (*) [32])(pcVar50 + 0xc0) = ZEXT1632(auVar56);
  pcVar50[0] = '\b';
  pcVar50[1] = '\0';
  pcVar50[2] = '\0';
  pcVar50[3] = '\0';
  pcVar50[4] = '\0';
  pcVar50[5] = '\0';
  pcVar50[6] = '\0';
  pcVar50[7] = '\0';
  pcVar50[8] = '\b';
  pcVar50[9] = '\0';
  pcVar50[10] = '\0';
  pcVar50[0xb] = '\0';
  pcVar50[0xc] = '\0';
  pcVar50[0xd] = '\0';
  pcVar50[0xe] = '\0';
  pcVar50[0xf] = '\0';
  pcVar50[0x10] = '\b';
  pcVar50[0x11] = '\0';
  pcVar50[0x12] = '\0';
  pcVar50[0x13] = '\0';
  pcVar50[0x14] = '\0';
  pcVar50[0x15] = '\0';
  pcVar50[0x16] = '\0';
  pcVar50[0x17] = '\0';
  pcVar50[0x18] = '\b';
  pcVar50[0x19] = '\0';
  pcVar50[0x1a] = '\0';
  pcVar50[0x1b] = '\0';
  pcVar50[0x1c] = '\0';
  pcVar50[0x1d] = '\0';
  pcVar50[0x1e] = '\0';
  pcVar50[0x1f] = '\0';
  local_1df8._8_4_ = 0x7f800000;
  local_1df8._0_8_ = 0x7f8000007f800000;
  local_1df8._12_4_ = 0x7f800000;
  in_00 = (BuildRecord *)&lbbox;
  if (local_848 != 0) {
    pBVar45 = &values[0].dt;
    uVar52 = 0;
    local_1df8._8_4_ = 0x7f800000;
    local_1df8._0_8_ = 0x7f8000007f800000;
    local_1df8._12_4_ = 0x7f800000;
    local_1dc8._8_4_ = 0x7f800000;
    local_1dc8._0_8_ = 0x7f8000007f800000;
    local_1dc8._12_4_ = 0x7f800000;
    local_1e08._8_4_ = 0xff800000;
    local_1e08._0_8_ = 0xff800000ff800000;
    local_1e08._12_4_ = 0xff800000;
    local_1dd8._8_4_ = 0xff800000;
    local_1dd8._0_8_ = 0xff800000ff800000;
    local_1dd8._12_4_ = 0xff800000;
    do {
      createLargeLeaf((NodeRecordMB4D *)&lbbox_1,this,in_00,alloc);
      pBVar45[-10].lower = (float)lbbox_1.bounds0.lower.field_0._0_4_;
      pBVar45[-10].upper = (float)lbbox_1.bounds0.lower.field_0._4_4_;
      auVar24._8_8_ = lbbox_1.bounds0.upper.field_0._8_8_;
      auVar24._0_8_ = lbbox_1.bounds0.upper.field_0._0_8_;
      *(undefined1 (*) [16])(pBVar45 + -8) = auVar24;
      pBVar45[-6].lower = (float)lbbox_1.bounds1.lower.field_0._0_4_;
      pBVar45[-6].upper = (float)lbbox_1.bounds1.lower.field_0._4_4_;
      pBVar45[-5].lower = (float)lbbox_1.bounds1.lower.field_0._8_4_;
      pBVar45[-5].upper = (float)lbbox_1.bounds1.lower.field_0._12_4_;
      pBVar45[-4].lower = (float)lbbox_1.bounds1.upper.field_0._0_4_;
      pBVar45[-4].upper = (float)lbbox_1.bounds1.upper.field_0._4_4_;
      pBVar45[-3].lower = (float)lbbox_1.bounds1.upper.field_0._8_4_;
      pBVar45[-3].upper = (float)lbbox_1.bounds1.upper.field_0._12_4_;
      pBVar45[-2].lower = (float)aStack_1bd8._0_4_;
      pBVar45[-2].upper = aStack_1bd8.m128[1];
      pBVar45[-1].lower = (float)aStack_1bd8._8_4_;
      pBVar45[-1].upper = aStack_1bd8.m128[3];
      *pBVar45 = local_1bc8;
      local_1e08 = vmaxps_avx(local_1e08,*(undefined1 (*) [16])(pBVar45 + -6));
      local_1dc8 = vminps_avx(local_1dc8,*(undefined1 (*) [16])(pBVar45 + -4));
      local_1df8 = vminps_avx(local_1df8,auVar24);
      local_1dd8 = vmaxps_avx(local_1dd8,*(undefined1 (*) [16])(pBVar45 + -2));
      uVar52 = uVar52 + 1;
      pBVar45 = pBVar45 + 0xc;
      in_00 = (BuildRecord *)
              &in_00[1].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.upper;
    } while (uVar52 < local_848);
  }
  uVar40 = uVar40 | (ulong)pcVar50;
  if (((uint)uVar40 & 0xf) == 1) {
    if (local_848 != 0) {
      uVar51 = (ulong)pcVar50 & 0xfffffffffffffff0;
      pfVar41 = &values[0].dt.upper;
      uVar52 = 0;
      auVar69._8_4_ = 0x7f7fffff;
      auVar69._0_8_ = 0x7f7fffff7f7fffff;
      auVar69._12_4_ = 0x7f7fffff;
      auVar74._8_4_ = 0xff7fffff;
      auVar74._0_8_ = 0xff7fffffff7fffff;
      auVar74._12_4_ = 0xff7fffff;
      auVar77._8_4_ = 0x7fffffff;
      auVar77._0_8_ = 0x7fffffff7fffffff;
      auVar77._12_4_ = 0x7fffffff;
      do {
        *(undefined8 *)(uVar51 + uVar52 * 8) = *(undefined8 *)(pfVar41 + -0x15);
        fVar4 = ((BBox1f *)(pfVar41 + -1))->lower;
        fVar78 = 1.0 / (*pfVar41 - fVar4);
        fVar17 = -fVar4 * fVar78;
        auVar56 = vshufps_avx(ZEXT416((uint)fVar17),ZEXT416((uint)fVar17),0);
        auVar58 = vshufps_avx(ZEXT416((uint)(1.0 - fVar17)),ZEXT416((uint)(1.0 - fVar17)),0);
        auVar86._0_4_ = pfVar41[-9] * auVar56._0_4_ + pfVar41[-0x11] * auVar58._0_4_;
        auVar86._4_4_ = pfVar41[-8] * auVar56._4_4_ + pfVar41[-0x10] * auVar58._4_4_;
        auVar86._8_4_ = pfVar41[-7] * auVar56._8_4_ + pfVar41[-0xf] * auVar58._8_4_;
        auVar86._12_4_ = pfVar41[-6] * auVar56._12_4_ + pfVar41[-0xe] * auVar58._12_4_;
        auVar81._0_4_ = pfVar41[-5] * auVar56._0_4_ + pfVar41[-0xd] * auVar58._0_4_;
        auVar81._4_4_ = pfVar41[-4] * auVar56._4_4_ + pfVar41[-0xc] * auVar58._4_4_;
        auVar81._8_4_ = pfVar41[-3] * auVar56._8_4_ + pfVar41[-0xb] * auVar58._8_4_;
        auVar81._12_4_ = pfVar41[-2] * auVar56._12_4_ + pfVar41[-10] * auVar58._12_4_;
        fVar78 = (1.0 - fVar4) * fVar78;
        auVar56 = vshufps_avx(ZEXT416((uint)fVar78),ZEXT416((uint)fVar78),0);
        auVar58 = vshufps_avx(ZEXT416((uint)(1.0 - fVar78)),ZEXT416((uint)(1.0 - fVar78)),0);
        auVar83._0_4_ = pfVar41[-9] * auVar56._0_4_ + pfVar41[-0x11] * auVar58._0_4_;
        auVar83._4_4_ = pfVar41[-8] * auVar56._4_4_ + pfVar41[-0x10] * auVar58._4_4_;
        auVar83._8_4_ = pfVar41[-7] * auVar56._8_4_ + pfVar41[-0xf] * auVar58._8_4_;
        auVar83._12_4_ = pfVar41[-6] * auVar56._12_4_ + pfVar41[-0xe] * auVar58._12_4_;
        auVar79._0_4_ = pfVar41[-5] * auVar56._0_4_ + pfVar41[-0xd] * auVar58._0_4_;
        auVar79._4_4_ = pfVar41[-4] * auVar56._4_4_ + pfVar41[-0xc] * auVar58._4_4_;
        auVar79._8_4_ = pfVar41[-3] * auVar56._8_4_ + pfVar41[-0xb] * auVar58._8_4_;
        auVar79._12_4_ = pfVar41[-2] * auVar56._12_4_ + pfVar41[-10] * auVar58._12_4_;
        auVar72 = vminps_avx(auVar86,auVar69);
        auVar58 = vmaxps_avx(auVar81,auVar74);
        auVar64 = vminps_avx(auVar83,auVar69);
        auVar57 = vmaxps_avx(auVar79,auVar74);
        auVar56 = vandps_avx(auVar72,auVar77);
        auVar84._0_4_ = auVar56._0_4_ * 4.7683716e-07;
        auVar84._4_4_ = auVar56._4_4_ * 4.7683716e-07;
        auVar84._8_4_ = auVar56._8_4_ * 4.7683716e-07;
        auVar84._12_4_ = auVar56._12_4_ * 4.7683716e-07;
        auVar72 = vsubps_avx(auVar72,auVar84);
        auVar56 = vandps_avx(auVar58,auVar77);
        auVar82._0_4_ = auVar58._0_4_ + auVar56._0_4_ * 4.7683716e-07;
        auVar82._4_4_ = auVar58._4_4_ + auVar56._4_4_ * 4.7683716e-07;
        auVar82._8_4_ = auVar58._8_4_ + auVar56._8_4_ * 4.7683716e-07;
        auVar82._12_4_ = auVar58._12_4_ + auVar56._12_4_ * 4.7683716e-07;
        auVar56 = vandps_avx(auVar64,auVar77);
        auVar85._0_4_ = auVar56._0_4_ * 4.7683716e-07;
        auVar85._4_4_ = auVar56._4_4_ * 4.7683716e-07;
        auVar85._8_4_ = auVar56._8_4_ * 4.7683716e-07;
        auVar85._12_4_ = auVar56._12_4_ * 4.7683716e-07;
        auVar58 = vsubps_avx(auVar64,auVar85);
        auVar56 = vandps_avx(auVar57,auVar77);
        *(int *)(uVar51 + 0x20 + uVar52 * 4) = auVar72._0_4_;
        uVar7 = vextractps_avx(auVar72,1);
        *(undefined4 *)(uVar51 + 0x40 + uVar52 * 4) = uVar7;
        auVar80._0_4_ = auVar56._0_4_ * 4.7683716e-07 + auVar57._0_4_;
        auVar80._4_4_ = auVar56._4_4_ * 4.7683716e-07 + auVar57._4_4_;
        auVar80._8_4_ = auVar56._8_4_ * 4.7683716e-07 + auVar57._8_4_;
        auVar80._12_4_ = auVar56._12_4_ * 4.7683716e-07 + auVar57._12_4_;
        uVar7 = vextractps_avx(auVar72,2);
        *(undefined4 *)(uVar51 + 0x60 + uVar52 * 4) = uVar7;
        *(float *)(uVar51 + 0x30 + uVar52 * 4) = auVar82._0_4_;
        uVar7 = vextractps_avx(auVar82,1);
        *(undefined4 *)(uVar51 + 0x50 + uVar52 * 4) = uVar7;
        auVar56 = vsubps_avx(auVar58,auVar72);
        uVar7 = vextractps_avx(auVar82,2);
        *(undefined4 *)(uVar51 + 0x70 + uVar52 * 4) = uVar7;
        *(int *)(uVar51 + 0x80 + uVar52 * 4) = auVar56._0_4_;
        uVar7 = vextractps_avx(auVar56,1);
        *(undefined4 *)(uVar51 + 0xa0 + uVar52 * 4) = uVar7;
        auVar58 = vsubps_avx(auVar80,auVar82);
        uVar7 = vextractps_avx(auVar56,2);
        *(undefined4 *)(uVar51 + 0xc0 + uVar52 * 4) = uVar7;
        *(int *)(uVar51 + 0x90 + uVar52 * 4) = auVar58._0_4_;
        uVar7 = vextractps_avx(auVar58,1);
        *(undefined4 *)(uVar51 + 0xb0 + uVar52 * 4) = uVar7;
        uVar7 = vextractps_avx(auVar58,2);
        *(undefined4 *)(uVar51 + 0xd0 + uVar52 * 4) = uVar7;
        uVar52 = uVar52 + 1;
        pfVar41 = pfVar41 + 0x18;
      } while (local_848 != uVar52);
    }
  }
  else {
    BuilderT<embree::NodeRefPtr<4>,embree::avx::RecalculatePrimRef<embree::Instance>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Set,embree::avx::CreateMSMBlurLeaf<4,embree::Instance,embree::InstancePrimitive>,embree::Scene::BuildProgressMonitorInterface>
    ::createLargeLeaf();
  }
  BVar11 = BStack_1840;
  BVar9 = local_1848;
  if ((bVar49 & 1) == 0) {
    (__return_storage_ptr__->ref).ptr = uVar40;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1df8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         local_1df8._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1e08._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1e08._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1dc8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1dc8._8_8_;
  }
  else {
    vSplitPos.field_0.v[0] = (longlong)&local_18a8;
    vSplitPos.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    local_1b18.m128[2] = INFINITY;
    local_1b18._0_8_ = 0x7f8000007f800000;
    local_1b18.m128[3] = INFINITY;
    local_1b08.m128[2] = -INFINITY;
    local_1b08._0_8_ = 0xff800000ff800000;
    local_1b08.m128[3] = -INFINITY;
    aStack_1af8.m128 = local_1b18.m128;
    local_1ae8.m128 = local_1b08.m128;
    uVar52 = (long)BStack_1840 - (long)local_1848;
    if (uVar52 < 0xc00) {
      aVar75 = local_1b18;
      aVar71 = local_1b08;
      aVar67 = local_1b18;
      aVar70 = local_1b08;
      if ((ulong)local_1848 < (ulong)BStack_1840) {
        lVar37 = (long)local_1848 * 0x50 + 0xc;
        aVar70.m128[2] = -INFINITY;
        aVar70._0_8_ = 0xff800000ff800000;
        aVar70.m128[3] = -INFINITY;
        aVar75.m128[2] = INFINITY;
        aVar75._0_8_ = 0x7f8000007f800000;
        aVar75.m128[3] = INFINITY;
        aVar71 = aVar70;
        aVar67 = aVar75;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0 =
             local_1b18;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0 =
             local_1b08;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0 =
             local_1b18;
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0 =
             local_1b08;
        do {
          right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
          _0_4_ = BStack_1820.lower;
          right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
          _4_4_ = BStack_1820.upper;
          pIVar15 = *(Instance **)
                     (*(long *)(*(long *)vSplitPos.field_0.v[1] + 0x1e8) +
                     (ulong)*(uint *)((long)&((*(PrimRefMB **)((long)local_1818 + 0x20))->lbounds).
                                             bounds0.lower.field_0 + lVar37) * 8);
          Instance::nonlinearBounds
                    (&lbbox_1,pIVar15,(BBox1f *)&right,&(pIVar15->super_Geometry).time_range,
                     (pIVar15->super_Geometry).fnumTimeSegments);
          auVar23._8_4_ = lbbox_1.bounds0.lower.field_0.m128[2];
          auVar23._0_8_ = lbbox_1.bounds0.lower.field_0._0_8_;
          auVar23._12_2_ = lbbox_1.bounds0.lower.field_0._12_2_;
          auVar23._14_2_ = lbbox_1.bounds0.lower.field_0._14_2_;
          aVar75.m128 = (__m128)vminps_avx(aVar75.m128,auVar23);
          auVar25._8_8_ = lbbox_1.bounds0.upper.field_0._8_8_;
          auVar25._0_8_ = lbbox_1.bounds0.upper.field_0._0_8_;
          aVar71.m128 = (__m128)vmaxps_avx(aVar71.m128,auVar25);
          auVar26._8_8_ = lbbox_1.bounds1.lower.field_0._8_8_;
          auVar26._0_8_ = lbbox_1.bounds1.lower.field_0._0_8_;
          aVar67.m128 = (__m128)vminps_avx(aVar67.m128,auVar26);
          auVar27._8_8_ = lbbox_1.bounds1.upper.field_0._8_8_;
          auVar27._0_8_ = lbbox_1.bounds1.upper.field_0._0_8_;
          aVar70.m128 = (__m128)vmaxps_avx(aVar70.m128,auVar27);
          lVar37 = lVar37 + 0x50;
          uVar52 = uVar52 - 1;
        } while (uVar52 != 0);
      }
    }
    else {
      lbbox_1.bounds0.lower.field_0._12_2_ = 0x401;
      lbbox_1.bounds1.lower.field_0._0_8_ = 0;
      lbbox_1.bounds1.lower.field_0._8_8_ = 0;
      tbb::detail::r1::initialize((task_group_context *)&lbbox_1);
      BVar34 = BStack_1840;
      BVar12 = local_1848;
      BStack_1840.lower = BVar11.lower;
      BStack_1840.upper = BVar11.upper;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_4_ =
           BStack_1840.lower;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._4_4_ =
           BStack_1840.upper;
      local_1848.lower = BVar9.lower;
      local_1848.upper = BVar9.upper;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_4_ =
           local_1848.lower;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._12_4_ =
           local_1848.upper;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0x400;
      isLeft.split = (Split *)&vSplitMask;
      isLeft.vSplitPos = &vSplitPos;
      local_1848 = BVar12;
      BStack_1840 = BVar34;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::Instance>>(embree::avx::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::Instance>>(embree::avx::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::Instance>>(embree::avx::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::Instance>>(embree::avx::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::Instance>>(embree::avx::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&left,(d1 *)&right,
                 (blocked_range<unsigned_long> *)&local_1b18.field_1,
                 (LBBox<embree::Vec3fa> *)&isLeft,
                 (anon_class_16_2_ed117de8_conflict31 *)isLeft.split,
                 (anon_class_1_0_00000001 *)&lbbox_1,
                 (task_group_context *)
                 new_vector._M_t.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl);
      cVar36 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&lbbox_1);
      if (cVar36 != '\0') {
        prVar44 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar44,"task cancelled");
        __cxa_throw(prVar44,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&lbbox_1);
      aVar75 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0;
      aVar71 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0;
      aVar67 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0;
      aVar70 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0;
    }
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0 = aVar70;
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0 = aVar67;
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0 = aVar71;
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0 = aVar75;
    (__return_storage_ptr__->ref).ptr = uVar40;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_;
    local_1dd8._0_8_ =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_;
    local_1dd8._8_8_ =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_;
  }
  *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1dd8._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
       local_1dd8._8_8_;
  __return_storage_ptr__->dt = BStack_1820;
  if (local_848 == 0) {
    return __return_storage_ptr__;
  }
  uVar40 = 0;
  do {
    pBVar16 = local_8c8[uVar40];
    pBVar45 = pBVar16 + 1;
    *pBVar45 = (BBox1f)((long)*pBVar45 + -1);
    if ((*pBVar45 == (BBox1f)0x0) && (BVar9 = *pBVar16, BVar9 != (BBox1f)0x0)) {
      lVar37 = *(undefined8 *)((long)BVar9 + 0x18);
      pvVar39 = *(void **)((long)BVar9 + 0x20);
      if (pvVar39 != (void *)0x0) {
        if ((ulong)(lVar37 * 0x50) < 0x1c00000) {
          alignedFree(pvVar39);
        }
        else {
          os_free(pvVar39,lVar37 * 0x50,*(bool *)((long)BVar9 + 8));
        }
      }
      if (lVar37 != 0) {
        (**(code **)**(undefined8 **)BVar9)(*(undefined8 **)BVar9,lVar37 * -0x50,1);
      }
      *(undefined8 *)((long)BVar9 + 0x10) = 0;
      *(undefined8 *)((long)BVar9 + 0x18) = 0;
      *(undefined8 *)((long)BVar9 + 0x20) = 0;
      operator_delete((void *)BVar9);
    }
    uVar40 = uVar40 + 1;
  } while (uVar40 < local_848);
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }